

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint uVar4;
  uchar *puVar5;
  uchar uVar6;
  int iVar7;
  ulong uVar8;
  mbedtls_x509_crt *crt;
  ulong uVar9;
  void **ppvVar10;
  ushort uVar11;
  mbedtls_ssl_config *pmVar12;
  char *format;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  ulong uVar13;
  _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr **pp_Var14;
  mbedtls_x509_crt *cert;
  int iVar15;
  mbedtls_pk_context_conflict local_68;
  mbedtls_x509_crt *local_50;
  mbedtls_ssl_ciphersuite_t *local_48;
  int local_3c;
  mbedtls_x509_crt *local_38;
  
  uVar2 = ssl->conf->authmode;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1d56,"=> parse certificate");
  bVar3 = ssl->handshake->ciphersuite_info->key_exchange;
  if ((bVar3 < 0xb) && ((0x69eU >> (bVar3 & 0x1f) & 1) != 0)) {
    if (ssl->conf->endpoint == '\x01') {
      if (bVar3 != 7) {
        if (uVar2 != '\0') goto LAB_001a47d7;
        ssl->session_negotiate->verify_result = 0x80;
      }
      goto LAB_001a48fe;
    }
LAB_001a47d7:
    iVar7 = mbedtls_ssl_read_record(ssl,1);
    if (iVar7 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1d6a,"mbedtls_ssl_read_record",iVar7);
      return iVar7;
    }
    if ((((ssl->conf->endpoint != '\0') &&
         (uVar8 = (ulong)(ssl->conf->transport == '\x01') * 8, ssl->in_hslen == uVar8 + 7)) &&
        (ssl->in_msgtype == 0x16)) &&
       ((puVar5 = ssl->in_msg, *puVar5 == '\v' &&
        (uVar8 = uVar8 | 4, puVar5[uVar8 + 2] == '\0' && *(short *)(puVar5 + uVar8) == 0)))) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1c29,"peer has no certificate");
      ssl->session_negotiate->verify_result = 0x40;
      if (uVar2 != '\x01') {
        return -0x7480;
      }
      goto LAB_001a4920;
    }
    ssl_clear_peer_cert(ssl->session_negotiate);
    crt = (mbedtls_x509_crt *)calloc(1,0x2f0);
    if (crt == (mbedtls_x509_crt *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1d81,"alloc(%zu bytes) failed",0x2f0);
      mbedtls_ssl_send_alert_message(ssl,'\x02','P');
      return -0x7f00;
    }
    mbedtls_x509_crt_init(crt);
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1b98,"bad certificate message");
LAB_001a4992:
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      iVar7 = -0x7700;
      cert = crt;
LAB_001a4ac7:
      mbedtls_x509_crt_free(cert);
      free(cert);
      return iVar7;
    }
    puVar5 = ssl->in_msg;
    if (*puVar5 != '\v') goto LAB_001a4992;
    uVar9 = ssl->in_hslen;
    uVar8 = (ulong)(ssl->conf->transport == '\x01') * 8;
    local_38 = crt;
    if (uVar9 < uVar8 + 10) {
      iVar7 = 0x1ba5;
LAB_001a4aa4:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,iVar7,"bad certificate message");
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      iVar7 = -0x7300;
      cert = local_38;
      goto LAB_001a4ac7;
    }
    uVar13 = uVar8 | 4;
    if ((puVar5[uVar13] != '\0') ||
       (uVar9 != (ushort)(*(ushort *)(puVar5 + uVar13 + 1) << 8 |
                         *(ushort *)(puVar5 + uVar13 + 1) >> 8) + uVar13 + 3)) {
      iVar7 = 0x1bb4;
      goto LAB_001a4aa4;
    }
    uVar8 = uVar8 | 7;
    do {
      uVar13 = uVar8 + 3;
      if (uVar9 < uVar13) {
        iVar7 = 0x1bc1;
        goto LAB_001a4aa4;
      }
      puVar5 = ssl->in_msg;
      if (puVar5[uVar8] != '\0') {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1bca,"bad certificate message");
        mbedtls_ssl_send_alert_message(ssl,'\x02','+');
        iVar7 = -0x7a00;
        cert = local_38;
        goto LAB_001a4ac7;
      }
      uVar11 = *(ushort *)(puVar5 + uVar8 + 1) << 8 | *(ushort *)(puVar5 + uVar8 + 1) >> 8;
      if ((uVar11 < 0x80) || (uVar8 = uVar11 + uVar13, uVar9 < uVar8)) {
        iVar7 = 0x1bd7;
        goto LAB_001a4aa4;
      }
      iVar7 = mbedtls_x509_crt_parse_der(local_38,puVar5 + uVar13,(ulong)uVar11);
      cert = local_38;
      if (iVar7 < -0x2580) {
        if (iVar7 != -0x262e) {
          if (iVar7 == -0x2880) {
            uVar6 = 'P';
          }
          else {
LAB_001a4bc1:
            uVar6 = '*';
          }
LAB_001a4bc3:
          mbedtls_ssl_send_alert_message(ssl,'\x02',uVar6);
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1c12," mbedtls_x509_crt_parse_der",iVar7);
          if (iVar7 == 0) goto LAB_001a4c03;
          goto LAB_001a4ac7;
        }
      }
      else if (iVar7 != 0) {
        if (iVar7 != -0x2580) goto LAB_001a4bc1;
        uVar6 = '+';
        goto LAB_001a4bc3;
      }
      uVar9 = ssl->in_hslen;
    } while (uVar8 < uVar9);
    mbedtls_debug_print_crt
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1c19,"peer certificate",local_38);
LAB_001a4c03:
    if (uVar2 != '\0') {
      ciphersuite = ssl->handshake->ciphersuite_info;
      if (ssl->f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1c6d,"Use configuration-specific verification callback");
        pmVar12 = ssl->conf;
        pp_Var14 = &pmVar12->f_vrfy;
        ppvVar10 = &pmVar12->p_vrfy;
      }
      else {
        pp_Var14 = &ssl->f_vrfy;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1c69,"Use context-specific verification callback");
        ppvVar10 = &ssl->p_vrfy;
        pmVar12 = ssl->conf;
      }
      local_50 = pmVar12->ca_chain;
      local_3c = mbedtls_x509_crt_verify_restartable
                           (local_38,local_50,pmVar12->ca_crl,pmVar12->cert_profile,ssl->hostname,
                            &ssl->session_negotiate->verify_result,*pp_Var14,*ppvVar10,
                            (mbedtls_x509_crt_restart_ctx *)0x0);
      if (local_3c != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1ca2,"x509_verify_cert",local_3c);
      }
      iVar7 = mbedtls_pk_can_do(&crt->pk,MBEDTLS_PK_ECKEY);
      cert = local_38;
      iVar15 = local_3c;
      if (iVar7 != 0) {
        local_68.priv_id = (crt->pk).priv_id;
        local_68._20_4_ = *(undefined4 *)&(crt->pk).field_0x14;
        local_68.pk_info = (crt->pk).pk_info;
        local_68.pk_ctx = (crt->pk).pk_ctx;
        local_48 = ciphersuite;
        mbedtls_pk_get_type(&local_68);
        cert = local_38;
        iVar15 = local_3c;
        ciphersuite = local_48;
        if (*local_68.pk_ctx == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1cbc,"invalid group ID");
          iVar7 = -0x6c00;
          goto LAB_001a4ac7;
        }
        if ((*local_68.pk_ctx != 3) ||
           (iVar7 = mbedtls_ssl_check_curve_tls_id(ssl,0x17), iVar7 != 0)) {
          puVar1 = &ssl->session_negotiate->verify_result;
          *puVar1 = *puVar1 | 0x10000;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1cc3,"bad certificate (EC key curve)");
          if (iVar15 == 0) {
            iVar15 = -0x7a00;
          }
        }
      }
      iVar7 = mbedtls_ssl_check_cert_usage
                        (cert,ciphersuite,(uint)(ssl->conf->endpoint == '\0'),
                         &ssl->session_negotiate->verify_result);
      if ((iVar7 != 0) &&
         (mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1cd0,"bad certificate (usage extensions)"), iVar15 == 0)) {
        iVar15 = -0x7a00;
      }
      if (uVar2 == '\x02' && local_50 == (mbedtls_x509_crt *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1ce3,"got no CA chain");
        iVar15 = -0x7680;
LAB_001a4e4b:
        uVar4 = ssl->session_negotiate->verify_result;
        uVar6 = '1';
        if (((((uVar4 >> 8 & 1) == 0) && (uVar6 = '*', (uVar4 & 4) == 0)) &&
            (uVar6 = '+', (uVar4 & 0x1b800) == 0)) &&
           ((uVar6 = '-', (uVar4 & 1) == 0 && (uVar6 = ',', (uVar4 & 2) == 0)))) {
          uVar6 = (char)((uVar4 & 8) >> 3) * '\x02' + '.';
        }
        mbedtls_ssl_send_alert_message(ssl,'\x02',uVar6);
        iVar7 = iVar15;
      }
      else {
        iVar7 = 0;
        if ((iVar15 != 0) && (uVar2 != '\x01' || iVar15 != -0x2700 && iVar15 != -0x7a00))
        goto LAB_001a4e4b;
      }
      if (ssl->session_negotiate->verify_result == 0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1d0d,"Certificate verification flags clear");
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1d0b,"! Certificate verification flags %08x");
      }
      if (iVar7 != 0) goto LAB_001a4ac7;
    }
    ssl->session_negotiate->peer_cert = cert;
    format = "<= parse certificate";
    iVar7 = 0x1dc7;
  }
  else {
LAB_001a48fe:
    format = "<= skip parse certificate";
    iVar7 = 0x1d5a;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,iVar7,format);
LAB_001a4920:
  ssl->state = ssl->state + 1;
  return 0;
}

Assistant:

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)
{
    int ret = 0;
    int crt_expected;
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    const int authmode = ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET
                       ? ssl->handshake->sni_authmode
                       : ssl->conf->authmode;
#else
    const int authmode = ssl->conf->authmode;
#endif
    void *rs_ctx = NULL;
    mbedtls_x509_crt *chain = NULL;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> parse certificate"));

    crt_expected = ssl_parse_certificate_coordinate(ssl, authmode);
    if (crt_expected == SSL_CERTIFICATE_SKIP) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip parse certificate"));
        goto exit;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ssl->handshake->ecrs_enabled &&
        ssl->handshake->ecrs_state == ssl_ecrs_crt_verify) {
        chain = ssl->handshake->ecrs_peer_cert;
        ssl->handshake->ecrs_peer_cert = NULL;
        goto crt_verify;
    }
#endif

    if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
        /* mbedtls_ssl_read_record may have sent an alert already. We
           let it decide whether to alert. */
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
        goto exit;
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if (ssl_srv_check_client_no_crt_notification(ssl) == 0) {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;

        if (authmode != MBEDTLS_SSL_VERIFY_OPTIONAL) {
            ret = MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE;
        }

        goto exit;
    }
#endif /* MBEDTLS_SSL_SRV_C */

    /* Clear existing peer CRT structure in case we tried to
     * reuse a session but it failed, and allocate a new one. */
    ssl_clear_peer_cert(ssl->session_negotiate);

    chain = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));
    if (chain == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("alloc(%" MBEDTLS_PRINTF_SIZET " bytes) failed",
                                  sizeof(mbedtls_x509_crt)));
        mbedtls_ssl_send_alert_message(ssl,
                                       MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR);

        ret = MBEDTLS_ERR_SSL_ALLOC_FAILED;
        goto exit;
    }
    mbedtls_x509_crt_init(chain);

    ret = ssl_parse_certificate_chain(ssl, chain);
    if (ret != 0) {
        goto exit;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ssl->handshake->ecrs_enabled) {
        ssl->handshake->ecrs_state = ssl_ecrs_crt_verify;
    }

crt_verify:
    if (ssl->handshake->ecrs_enabled) {
        rs_ctx = &ssl->handshake->ecrs_ctx;
    }
#endif

    ret = ssl_parse_certificate_verify(ssl, authmode,
                                       chain, rs_ctx);
    if (ret != 0) {
        goto exit;
    }

#if !defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    {
        unsigned char *crt_start, *pk_start;
        size_t crt_len, pk_len;

        /* We parse the CRT chain without copying, so
         * these pointers point into the input buffer,
         * and are hence still valid after freeing the
         * CRT chain. */

        crt_start = chain->raw.p;
        crt_len   = chain->raw.len;

        pk_start = chain->pk_raw.p;
        pk_len   = chain->pk_raw.len;

        /* Free the CRT structures before computing
         * digest and copying the peer's public key. */
        mbedtls_x509_crt_free(chain);
        mbedtls_free(chain);
        chain = NULL;

        ret = ssl_remember_peer_crt_digest(ssl, crt_start, crt_len);
        if (ret != 0) {
            goto exit;
        }

        ret = ssl_remember_peer_pubkey(ssl, pk_start, pk_len);
        if (ret != 0) {
            goto exit;
        }
    }
#else /* !MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    /* Pass ownership to session structure. */
    ssl->session_negotiate->peer_cert = chain;
    chain = NULL;
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= parse certificate"));

exit:

    if (ret == 0) {
        ssl->state++;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ret == MBEDTLS_ERR_SSL_CRYPTO_IN_PROGRESS) {
        ssl->handshake->ecrs_peer_cert = chain;
        chain = NULL;
    }
#endif

    if (chain != NULL) {
        mbedtls_x509_crt_free(chain);
        mbedtls_free(chain);
    }

    return ret;
}